

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O3

void __thiscall
NshHistoryEntryCount_SuccessWhenFull_Test::TestBody(NshHistoryEntryCount_SuccessWhenFull_Test *this)

{
  int iVar1;
  char *message;
  char new_entry [10];
  nsh_history_t hist;
  AssertHelper local_850;
  Message local_848;
  internal local_840 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_838;
  char local_830 [12];
  nsh_history_t local_824;
  
  nsh_history_reset(&local_824);
  builtin_strncpy(local_830,"new_entry",10);
  iVar1 = 0x10;
  do {
    nsh_history_add_entry(&local_824,local_830);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  local_848.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = nsh_history_entry_count(&local_824);
  local_850.data_._0_4_ = 0x10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_840,"nsh_history_entry_count(&hist)","16u",(uint *)&local_848,(uint *)&local_850)
  ;
  if (local_840[0] == (internal)0x0) {
    testing::Message::Message(&local_848);
    if (local_838 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_838->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_850,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
               ,0x59,message);
    testing::internal::AssertHelper::operator=(&local_850,&local_848);
    testing::internal::AssertHelper::~AssertHelper(&local_850);
    if ((long *)CONCAT44(local_848.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_848.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_848.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_848.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_838 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_838,local_838);
  }
  return;
}

Assistant:

TEST(NshHistoryEntryCount, SuccessWhenFull)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry[] = "new_entry";
    for (unsigned int i = 0; i < NSH_CMD_HISTORY_SIZE; i++) {
        nsh_history_add_entry(&hist, new_entry);
    }

    ASSERT_EQ(nsh_history_entry_count(&hist), NSH_CMD_HISTORY_SIZE);
}